

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O2

Am_String Am_Show_File_Dialog_For_Open(Am_String *initial_value)

{
  bool bVar1;
  Am_Value_List *list;
  Am_String *in_RSI;
  Am_String local_50;
  Am_Value v;
  Am_Value_List local_38;
  Am_Value_List local_28;
  
  Am_Value_List::Am_Value_List(&local_28);
  list = Am_Value_List::Add(&local_28,"Type filename for Read:",Am_TAIL,true);
  Am_Value_List::Am_Value_List(&local_38,list);
  Am_String::Am_String(&local_50,in_RSI);
  Am_Get_Input_From_Dialog((Am_Value_List *)&v,(Am_String *)&local_38,(int)&local_50,-10000,true);
  Am_String::~Am_String(&local_50);
  Am_Value_List::~Am_Value_List(&local_38);
  Am_Value_List::~Am_Value_List(&local_28);
  bVar1 = Am_Value::Valid(&v);
  if (bVar1) {
    Am_String::Am_String(initial_value,&v);
  }
  else {
    Am_String::Am_String(initial_value,"",true);
  }
  Am_Value::~Am_Value(&v);
  return (Am_String)(Am_String_Data *)initial_value;
}

Assistant:

Am_String
Am_Show_File_Dialog_For_Open(Am_String initial_value)
{
  Am_Value v = Am_Get_Input_From_Dialog(
      Am_Value_List().Add("Type filename for Read:"), initial_value);
  if (v.Valid())
    return v;
  else
    return "";
}